

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O0

Reals __thiscall Omega_h::measure_edges_metric(Omega_h *this,Mesh *mesh,Reals *metrics)

{
  LO size_in;
  void *extraout_RDX;
  Reals RVar1;
  Read<double> local_78 [2];
  allocator local_51;
  string local_50 [32];
  Read<int> local_30;
  Reals *local_20;
  Reals *metrics_local;
  Mesh *mesh_local;
  
  local_20 = metrics;
  metrics_local = (Reals *)mesh;
  mesh_local = (Mesh *)this;
  size_in = Mesh::nedges(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  Read<int>::Read(&local_30,size_in,0,1,(string *)local_50);
  Read<double>::Read(local_78,metrics);
  measure_edges_metric(this,mesh,&local_30,local_78);
  Read<double>::~Read(local_78);
  Read<int>::~Read(&local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals measure_edges_metric(Mesh* mesh, Reals metrics) {
  return measure_edges_metric(mesh, LOs(mesh->nedges(), 0, 1), metrics);
}